

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

bool __thiscall TasgridWrapper::checkSanePostRead(TasgridWrapper *this)

{
  int iVar1;
  TypeCommand TVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  undefined1 uVar8;
  bool bVar9;
  int iVar10;
  bool bVar11;
  test_result_wrapper test;
  command_tester com;
  test_result_wrapper local_e1;
  command_tester local_e0;
  array<TypeCommand,_1UL> local_dc;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_d8;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_b8;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_98;
  undefined1 local_78 [16];
  pointer local_68;
  TypeCommand aTStack_60 [6];
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_48;
  
  local_e0.command = this->command;
  local_e1.pass = true;
  lVar3 = *(long *)&this->field_0x8;
  if (lVar3 == 0) {
    bVar11 = true;
  }
  else {
    bVar11 = *(int *)(lVar3 + 0x20) == 0 || *(int *)(lVar3 + 0x14) == 0;
  }
  if (bVar11) {
    local_68 = (pointer)0x160000001e;
    aTStack_60[0] = command_refine_aniso;
    aTStack_60[1] = command_refine_surp;
    local_78._0_8_ = (pointer)0x1200000010;
    local_78._8_8_ = (pointer)0x1300000011;
    local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = command_tester::inside<8ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_e0,(array<TypeCommand,_8UL> *)local_78,&local_48);
  }
  else {
    bVar5 = false;
  }
  test_result_wrapper::fail_if(&local_e1,bVar5,"the grid has no loaded data");
  if ((bVar11) &&
     (local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)&this->field_0x8 == 0) {
    bVar11 = true;
  }
  else {
    bVar11 = *(int *)(*(long *)&this->field_0x8 + 0x14) == 0;
  }
  if (bVar11) {
    local_68 = (pointer)0x160000001e;
    aTStack_60[0] = command_refine_aniso;
    aTStack_60[1] = command_refine_surp;
    local_78._0_8_ = (pointer)0x1200000010;
    local_78._8_8_ = (pointer)0x1300000011;
    aTStack_60[2] = command_get_candidate_construction;
    local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = command_tester::inside<9ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_e0,(array<TypeCommand,_9UL> *)local_78,&local_98);
  }
  else {
    bVar5 = false;
  }
  test_result_wrapper::fail_if(&local_e1,bVar5,"the grid has no outputs");
  if ((bVar11) &&
     (local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->ref_output;
  if (*(long *)&this->field_0x8 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = *(int *)(*(long *)&this->field_0x8 + 0x14);
  }
  if (iVar1 < iVar10) {
    bVar11 = false;
  }
  else {
    local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_68 = (pointer)0x0;
    bVar11 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                       (&local_e0,(array<TypeCommand,_1UL> *)&local_b8,
                        (vector<TypeCommand,_std::allocator<TypeCommand>_> *)local_78);
  }
  test_result_wrapper::fail_if
            (&local_e1,bVar11,"-refout outside of the range, note the outputs are indexed from zero"
            );
  if ((iVar10 <= iVar1) && ((pointer)local_78._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
  }
  if (this->ref_output == -1) {
    plVar4 = *(long **)&this->field_0x8;
    if (plVar4 == (long *)0x0) {
      bVar11 = true;
    }
    else {
      bVar11 = *(int *)((long)plVar4 + 0x14) < 2;
    }
    bVar5 = false;
    if (plVar4 == (long *)0x0) goto LAB_0012dd00;
    bVar9 = false;
    if (!bVar11) {
      cVar6 = (**(code **)(*plVar4 + 0x10))();
      if (cVar6 == '\0') goto LAB_0012dd00;
      local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
      local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar5 = true;
      bVar9 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                        (&local_e0,(array<TypeCommand,_1UL> *)&local_d8,&local_b8);
    }
  }
  else {
LAB_0012dd00:
    bVar5 = false;
    bVar9 = false;
  }
  test_result_wrapper::fail_if
            (&local_e1,bVar9,"-refout cannot use -1 when working with Global grids");
  if ((bVar5) &&
     (local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (((*(long **)&this->field_0x8 == (long *)0x0) ||
      (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar6 == '\0')) &&
     ((*(long **)&this->field_0x8 == (long *)0x0 ||
      (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar6 == '\0')))) {
    bVar11 = false;
  }
  else {
    bVar11 = this->command == command_refine_aniso;
  }
  test_result_wrapper::fail_if
            (&local_e1,bVar11,
             "anisotropic operations are available only for Global, Sequence and Fourier grids");
  if (*(long **)&this->field_0x8 == (long *)0x0) {
    bVar7 = 0;
  }
  else {
    bVar7 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
  }
  test_result_wrapper::fail_if
            (&local_e1,(bool)(this->command == command_refine_surp & bVar7),
             "surplus refinement cannot be applied to Fourier grids");
  TVar2 = this->command;
  if ((TVar2 == command_refine_aniso) ||
     (((TVar2 == command_get_candidate_construction || (TVar2 == command_refine)) &&
      (((*(long **)&this->field_0x8 != (long *)0x0 &&
        (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x10))(), cVar6 != '\0')) ||
       (((*(long **)&this->field_0x8 != (long *)0x0 &&
         (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x18))(), cVar6 != '\0')) ||
        ((*(long **)&this->field_0x8 != (long *)0x0 &&
         (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x30))(), cVar6 != '\0')))))))))) {
    if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0012de37:
      if (*(long **)&this->field_0x8 == (long *)0x0) {
        uVar8 = false;
      }
      else {
        uVar8 = (**(code **)(**(long **)&this->field_0x8 + 0x28))();
      }
    }
    else {
      cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x20))();
      uVar8 = true;
      if (cVar6 == '\0') goto LAB_0012de37;
    }
    test_result_wrapper::fail_if
              (&local_e1,(bool)uVar8,
               "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
    test_result_wrapper::fail_if
              (&local_e1,this->depth_type == type_none,
               "anisotropic refinement requires depth type with -tt");
    if (this->ref_output == -1) {
      plVar4 = *(long **)&this->field_0x8;
      if (plVar4 == (long *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = *(int *)((long)plVar4 + 0x14) < 2;
      }
      bVar5 = false;
      if (plVar4 == (long *)0x0) goto LAB_0012de8d;
      bVar9 = false;
      if (!bVar11) {
        cVar6 = (**(code **)(*plVar4 + 0x10))();
        if (cVar6 == '\0') goto LAB_0012de8d;
        local_dc._M_elems[0] = (_Type)command_getanisocoeff;
        local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = true;
        bVar9 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                          (&local_e0,&local_dc,&local_d8);
      }
    }
    else {
LAB_0012de8d:
      bVar5 = false;
      bVar9 = false;
    }
    test_result_wrapper::fail_if
              (&local_e1,bVar9,"-refout cannot use -1 when working with Global grids");
    if ((bVar5) &&
       (local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    test_result_wrapper::worry_if
              (&local_e1,this->set_tolerance,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option"
              );
    test_result_wrapper::worry_if
              (&local_e1,this->set_tref,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option"
              );
  }
  if ((this->command != command_refine_surp) &&
     (((TVar2 != command_get_candidate_construction && (TVar2 != command_refine)) ||
      (((*(long **)&this->field_0x8 == (long *)0x0 ||
        (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar6 == '\0')) &&
       ((*(long **)&this->field_0x8 == (long *)0x0 ||
        (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar6 == '\0'))))))))
  goto LAB_0012dfcd;
  test_result_wrapper::fail_if
            (&local_e1,(bool)(this->set_tolerance ^ 1),
             "must specify -tolerance for surplus refinement");
  test_result_wrapper::fail_if(&local_e1,(bool)(this->set_tref ^ 1),"must specify -reftype option");
  if ((this->valsfilename)._M_string_length == 0) {
LAB_0012dfb7:
    uVar8 = false;
  }
  else if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0012df55:
    if (*(long **)&this->field_0x8 != (long *)0x0) {
      cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x18))();
      uVar8 = true;
      if (cVar6 != '\0') goto LAB_0012dfb9;
    }
    if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012dfb7;
    uVar8 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
  }
  else {
    cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x10))();
    uVar8 = true;
    if (cVar6 == '\0') goto LAB_0012df55;
  }
LAB_0012dfb9:
  test_result_wrapper::worry_if
            (&local_e1,(bool)uVar8,
             "the scale factors are not used with Global, Sequence and Fourier grids");
LAB_0012dfcd:
  if (((*(long **)&this->field_0x8 == (long *)0x0) ||
      (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar6 == '\0')) &&
     ((*(long **)&this->field_0x8 == (long *)0x0 ||
      (cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar6 == '\0')))) {
    bVar11 = false;
  }
  else {
    bVar11 = this->command == command_getpoly;
  }
  test_result_wrapper::fail_if
            (&local_e1,bVar11,"cannot call -getpoly for a grid that is neither Global nor Sequence")
  ;
  return local_e1.pass;
}

Assistant:

bool TasgridWrapper::checkSanePostRead() const{
    command_tester com{command};
    test_result_wrapper test;

    test.fail_if(grid.getNumLoaded() == 0 and
                 com.inside(CArr<8>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp}),
                 "the grid has no loaded data");
    test.fail_if(grid.getNumOutputs() == 0 and
                 com.inside(CArr<9>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp,
                             command_get_candidate_construction}),
                 "the grid has no outputs");

    test.fail_if(ref_output >= grid.getNumOutputs() and
                 com.inside(CArr<1>{command_getanisocoeff, }),
                 "-refout outside of the range, note the outputs are indexed from zero");
    test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                 com.inside(CArr<1>{command_getanisocoeff}),
                 "-refout cannot use -1 when working with Global grids");

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_refine_aniso,
                 "anisotropic operations are available only for Global, Sequence and Fourier grids");
    test.fail_if((grid.isFourier() and command == command_refine_surp),
                 "surplus refinement cannot be applied to Fourier grids");

    bool is_refine = (command == command_refine or command == command_get_candidate_construction);
    if (command == command_refine_aniso or (is_refine and (grid.isGlobal() or grid.isSequence() or grid.isFourier()))){
        test.fail_if(grid.isLocalPolynomial() or grid.isWavelet(),
                     "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
        test.fail_if(depth_type == type_none, "anisotropic refinement requires depth type with -tt");
        test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                     com.inside(CArr<1>{command_getanisocoeff}),
                     "-refout cannot use -1 when working with Global grids");

        test.worry_if(set_tolerance, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option");
        test.worry_if(set_tref, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option");
    }

    if (command == command_refine_surp or (is_refine and (grid.isLocalPolynomial() or grid.isWavelet()))){
        test.fail_if(not set_tolerance, "must specify -tolerance for surplus refinement");
        test.fail_if(not set_tref, "must specify -reftype option");

        test.worry_if(not valsfilename.empty() and (grid.isGlobal() or grid.isSequence() or grid.isFourier()),
                      "the scale factors are not used with Global, Sequence and Fourier grids");
    }

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_getpoly,
                 "cannot call -getpoly for a grid that is neither Global nor Sequence");

    return test;
}